

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewSymbolTreeVisitor.cpp
# Opt level: O1

void __thiscall
NewSymbolTreeVisitor::Visit(NewSymbolTreeVisitor *this,VariableDeclaration *variable_declaration)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  NewScopeLayer *pNVar3;
  Type *pTVar4;
  pointer pcVar5;
  int iVar6;
  mapped_type *pmVar7;
  runtime_error *this_00;
  _Alloc_hider _Var8;
  string new_type_name;
  Symbol local_d0;
  string local_b0;
  Symbol local_90;
  string local_70;
  string local_50;
  
  pNVar3 = this->current_layer_;
  pTVar4 = variable_declaration->type_;
  pcVar5 = (variable_declaration->variable_name_)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar5,
             pcVar5 + (variable_declaration->variable_name_)._M_string_length);
  Symbol::Symbol(&local_d0,&local_50);
  NewScopeLayer::DeclareVariable(pNVar3,pTVar4,&local_d0);
  paVar2 = &local_d0.name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.name_._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0.name_._M_dataplus._M_p,local_d0.name_.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pTVar4 = variable_declaration->type_;
  psVar1 = &pTVar4->type_name_;
  iVar6 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar6 != 0) {
    iVar6 = std::__cxx11::string::compare((char *)psVar1);
    if ((((iVar6 != 0) && (iVar6 = std::__cxx11::string::compare((char *)psVar1), iVar6 != 0)) &&
        (iVar6 = std::__cxx11::string::compare((char *)psVar1), iVar6 != 0)) &&
       (iVar6 = std::__cxx11::string::compare((char *)psVar1), iVar6 != 0)) {
      if ((pTVar4->type_name_)._M_dataplus._M_p[(pTVar4->type_name_)._M_string_length - 1] == ']') {
        pcVar5 = (pTVar4->type_name_)._M_dataplus._M_p;
        local_d0.name_._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_d0,pcVar5,pcVar5 + ((pTVar4->type_name_)._M_string_length - 2));
        pNVar3 = this->current_layer_;
        pcVar5 = (variable_declaration->variable_name_)._M_dataplus._M_p;
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,pcVar5,
                   pcVar5 + (variable_declaration->variable_name_)._M_string_length);
        Symbol::Symbol(&local_90,&local_b0);
        pmVar7 = std::__detail::
                 _Map_base<Symbol,_std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<Symbol,_std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&pNVar3->user_type_system_,&local_90);
        std::__cxx11::string::_M_assign((string *)pmVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90.name_._M_dataplus._M_p != &local_90.name_.field_2) {
          operator_delete(local_90.name_._M_dataplus._M_p,
                          local_90.name_.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        local_70.field_2._M_allocated_capacity = local_d0.name_.field_2._M_allocated_capacity;
        _Var8._M_p = local_d0.name_._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0.name_._M_dataplus._M_p == paVar2) {
          return;
        }
      }
      else {
        pNVar3 = this->current_layer_;
        pcVar5 = (variable_declaration->variable_name_)._M_dataplus._M_p;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar5,
                   pcVar5 + (variable_declaration->variable_name_)._M_string_length);
        Symbol::Symbol(&local_d0,&local_70);
        pmVar7 = std::__detail::
                 _Map_base<Symbol,_std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<Symbol,_std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&pNVar3->user_type_system_,&local_d0);
        std::__cxx11::string::_M_assign((string *)pmVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0.name_._M_dataplus._M_p != paVar2) {
          operator_delete(local_d0.name_._M_dataplus._M_p,
                          local_d0.name_.field_2._M_allocated_capacity + 1);
        }
        _Var8._M_p = local_70._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p == &local_70.field_2) {
          return;
        }
      }
      operator_delete(_Var8._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Can\'t declare variable of void type");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void NewSymbolTreeVisitor::Visit(VariableDeclaration* variable_declaration) {
  current_layer_->DeclareVariable(variable_declaration->type_,
                                  Symbol(variable_declaration->variable_name_));

  const std::string& type_name = variable_declaration->type_->type_name_;

  if (type_name == "void") {
    throw std::runtime_error("Can't declare variable of void type");
  }

  // pre type checking to resolve class methods and fields
  if (type_name != "int" && type_name != "boolean" && type_name != "int[]" &&
      type_name != "boolean[]") {
    if (type_name.back() != ']') {
      current_layer_
          ->user_type_system_[Symbol(variable_declaration->variable_name_)] =
          type_name;
    } else {
      std::string new_type_name(type_name.begin(), type_name.end() - 2);

      current_layer_
          ->user_type_system_[Symbol(variable_declaration->variable_name_)] =
          new_type_name;
    }
  }
}